

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O1

void __thiscall
bk_lib::pod_vector<long,std::allocator<long>>::
insert_impl<unsigned_int,bk_lib::detail::Memcpy<long>>
          (pod_vector<long,std::allocator<long>> *this,iterator pos,uint n,Memcpy<long> *pred)

{
  void *__src;
  uint uVar1;
  long *__dest;
  uint uVar2;
  
  uVar2 = *(uint *)(this + 8) + n;
  if (*(uint *)(this + 0xc) < uVar2) {
    uVar1 = 2 << ((byte)uVar2 & 0x1f);
    if (3 < uVar2) {
      uVar1 = uVar2;
    }
    uVar2 = *(uint *)(this + 0xc) * 3 >> 1;
    if (uVar2 < uVar1) {
      uVar2 = uVar1;
    }
    __dest = __gnu_cxx::new_allocator<long>::allocate
                       ((new_allocator<long> *)this,(ulong)uVar2,(void *)0x0);
    __src = *(void **)this;
    if (__src != (void *)0x0) {
      memcpy(__dest,__src,(long)pos - (long)__src & 0x7fffffff8);
    }
    if ((n != 0) && (__dest != (long *)0x0)) {
      memcpy(__dest + ((ulong)((long)pos - (long)__src) >> 3 & 0xffffffff),pred->first_,(ulong)n * 8
            );
    }
    if (pos != (iterator)0x0) {
      memcpy(__dest + ((ulong)((long)pos - (long)__src) >> 3 & 0xffffffff) + n,pos,
             ((ulong)*(uint *)(this + 8) * 8 + *(long *)this) - (long)pos);
    }
    if (*(void **)this != (void *)0x0) {
      operator_delete(*(void **)this);
    }
    *(long **)this = __dest;
    *(uint *)(this + 8) = *(int *)(this + 8) + n;
    *(uint *)(this + 0xc) = uVar2;
  }
  else {
    if (pos != (iterator)0x0) {
      memmove(pos + n,pos,((ulong)*(uint *)(this + 8) * 8 + *(long *)this) - (long)pos);
    }
    if (n != 0 && pos != (iterator)0x0) {
      memcpy(pos,pred->first_,(ulong)n << 3);
    }
    *(uint *)(this + 8) = *(int *)(this + 8) + n;
  }
  return;
}

Assistant:

void insert_impl(iterator pos, ST n, const P& pred) {
		assert(n == 0 || (size()+n) > size() );
		if (size()+n <= capacity()) {
			move_right(pos, n);
			pred(pos, n);
			ebo_.size += n;
		}
		else {
			size_type new_cap = grow_size(n);
			pointer temp      = ebo_.allocate(new_cap);
			size_type prefix  = static_cast<size_type>(pos-begin());
			// copy prefix
			if (const_pointer buf = begin()) {
				std::memcpy(temp, buf, prefix*sizeof(T));
			}
			// insert new stuff
			pred(temp+prefix, n);
			// copy suffix
			if (pos) {
				std::memcpy(temp+prefix+n, pos, (end()-pos)*sizeof(T));
			}
			ebo_.release();
			ebo_.buf  = temp;
			ebo_.size+= n;
			ebo_.cap  = new_cap;
		}
	}